

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::lastIndexOf<QListWidgetItem*,QListWidgetItem*>
                    (QList<QListWidgetItem_*> *vector,QListWidgetItem **u,qsizetype from)

{
  bool bVar1;
  DataOps *pDVar2;
  qsizetype qVar3;
  const_iterator *this;
  QListWidgetItem **ppQVar4;
  QList<QListWidgetItem_*> *in_RDX;
  long *in_RSI;
  QArrayDataPointer<QListWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  const_iterator n;
  const_iterator b;
  qsizetype in_stack_ffffffffffffff98;
  QList<QListWidgetItem_*> *in_stack_ffffffffffffffa0;
  QList<QListWidgetItem_*> *local_58;
  qsizetype local_40;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)in_RDX < 0) {
    pDVar2 = QArrayDataPointer<QListWidgetItem_*>::operator->(in_RDI);
    local_58 = (QList<QListWidgetItem_*> *)
               ((long)&(in_RDX->d).d +
               (pDVar2->super_QCommonArrayOps<QListWidgetItem_*>).super_Type.
               super_QArrayDataPointer<QListWidgetItem_*>.size);
  }
  else {
    in_stack_ffffffffffffffa0 = in_RDX;
    qVar3 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)in_RDI);
    local_58 = in_RDX;
    if (qVar3 <= (long)in_stack_ffffffffffffffa0) {
      qVar3 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)in_RDI);
      local_58 = (QList<QListWidgetItem_*> *)(qVar3 + -1);
    }
  }
  if ((long)local_58 < 0) {
LAB_008a6159:
    local_40 = -1;
  }
  else {
    local_10.i = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QListWidgetItem_*>::begin(in_stack_ffffffffffffffa0);
    local_18.i = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    QList<QListWidgetItem_*>::begin(in_stack_ffffffffffffffa0);
    QList<QListWidgetItem_*>::const_iterator::operator+
              ((const_iterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_18 = QList<QListWidgetItem_*>::const_iterator::operator+
                         ((const_iterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    do {
      bVar1 = QList<QListWidgetItem_*>::const_iterator::operator!=(&local_18,local_10);
      if (!bVar1) goto LAB_008a6159;
      this = QList<QListWidgetItem_*>::const_iterator::operator--(&local_18);
      ppQVar4 = QList<QListWidgetItem_*>::const_iterator::operator*(this);
    } while (*ppQVar4 != (QListWidgetItem *)*in_RSI);
    local_40 = QList<QListWidgetItem_*>::const_iterator::operator-(&local_18,local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

qsizetype lastIndexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from += vector.d->size;
    else if (from >= vector.size())
        from = vector.size() - 1;
    if (from >= 0) {
        auto b = vector.begin();
        auto n = vector.begin() + from + 1;
        while (n != b) {
            if (*--n == u)
                return qsizetype(n - b);
        }
    }
    return -1;
}